

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTDMT_compressionJob(void *jobDescription)

{
  ldmState_t *ldmState;
  pthread_mutex_t *ppVar1;
  BYTE *src;
  undefined4 uVar2;
  ZSTD_customMem customMem;
  int iVar3;
  uint uVar4;
  ZSTD_CCtx *cctx;
  size_t sVar6;
  unsigned_long_long *puVar7;
  ulong uVar8;
  long lVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar10;
  size_t dstCapacity;
  BYTE *pBVar11;
  ulong uVar12;
  void *dst;
  void *pvVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  buffer_t bVar18;
  buffer_t buf;
  ZSTD_CCtx_params jobParams;
  pthread_mutex_t *local_140;
  void *local_138;
  undefined8 in_stack_fffffffffffffed0;
  void *pvVar19;
  undefined8 in_stack_fffffffffffffed8;
  ulong uVar20;
  void *in_stack_fffffffffffffee0;
  rawSeq *prVar21;
  rawSeqStore_t local_f8;
  size_t local_d8;
  size_t sStack_d0;
  ZSTD_CCtx_params local_c0;
  rawSeq *prVar5;
  
  memcpy(&local_c0,(void *)((long)jobDescription + 200),0x90);
  ppVar1 = *(pthread_mutex_t **)((long)jobDescription + 0x68);
  pthread_mutex_lock(ppVar1);
  iVar3 = *(int *)((long)ppVar1 + 0x2c);
  if ((long)iVar3 == 0) {
    pthread_mutex_unlock(ppVar1);
    customMem.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffed8;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffed0;
    customMem.opaque = in_stack_fffffffffffffee0;
    cctx = ZSTD_createCCtx_advanced(customMem);
    uVar10 = extraout_RDX_00;
  }
  else {
    *(int *)((long)ppVar1 + 0x2c) = iVar3 + -1;
    cctx = *(ZSTD_CCtx **)((long)ppVar1 + (long)iVar3 * 8 + 0x40);
    pthread_mutex_unlock(ppVar1);
    uVar10 = extraout_RDX;
  }
  if ((*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78))->bufferSize == 0) {
    prVar5 = (rawSeq *)0x0;
    uVar20 = 0;
  }
  else {
    bVar18 = ZSTDMT_getBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78));
    prVar5 = (rawSeq *)bVar18.start;
    uVar10 = bVar18.capacity / 0xc;
    uVar20 = uVar10;
  }
  sStack_d0 = 0;
  local_d8 = 0;
  prVar21 = prVar5;
  if (cctx == (ZSTD_CCtx *)0x0) {
LAB_001714dd:
    pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
    *(undefined8 *)((long)jobDescription + 8) = 0xffffffffffffffc0;
LAB_001714f1:
    pthread_mutex_unlock((pthread_mutex_t *)((long)jobDescription + 0x10));
  }
  else {
    bVar18.capacity = uVar10;
    bVar18.start = *(void **)((long)jobDescription + 0x88);
    if (*(void **)((long)jobDescription + 0x88) == (void *)0x0) {
      bVar18 = ZSTDMT_getBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x70));
      dstCapacity = bVar18.capacity;
      if (bVar18.start == (void *)0x0) goto LAB_001714dd;
      *(buffer_t *)((long)jobDescription + 0x88) = bVar18;
    }
    else {
      dstCapacity = *(size_t *)((long)jobDescription + 0x90);
    }
    dst = bVar18.start;
    if ((local_c0.ldmParams.enableLdm != 0) && (prVar5 == (rawSeq *)0x0)) goto LAB_001714dd;
    if (*(int *)((long)jobDescription + 0xb8) != 0) {
      local_c0.fParams.checksumFlag = 0;
    }
    local_c0.ldmParams.enableLdm = 0;
    if (*(ZSTD_CDict **)((long)jobDescription + 0x158) == (ZSTD_CDict *)0x0) {
      bVar17 = *(int *)((long)jobDescription + 0xbc) == 0;
      puVar7 = (unsigned_long_long *)((long)jobDescription + 0x160);
      if (bVar17) {
        puVar7 = (unsigned_long_long *)((long)jobDescription + 0xb0);
      }
      local_c0.forceWindow = (int)bVar17;
      sVar6 = ZSTD_compressBegin_advanced_internal
                        (cctx,*(void **)((long)jobDescription + 0x98),
                         *(size_t *)((long)jobDescription + 0xa0),ZSTD_dct_rawContent,ZSTD_dtlm_fast
                         ,(ZSTD_CDict *)0x0,&local_c0,*puVar7);
      if (sVar6 < 0xffffffffffffff89) goto LAB_001716fd;
LAB_00171b5c:
      pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
      *(size_t *)((long)jobDescription + 8) = sVar6;
      goto LAB_001714f1;
    }
    sVar6 = ZSTD_compressBegin_advanced_internal
                      (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,
                       *(ZSTD_CDict **)((long)jobDescription + 0x158),&local_c0,
                       *(unsigned_long_long *)((long)jobDescription + 0x160));
    if (*(int *)((long)jobDescription + 0xbc) == 0) {
      __assert_fail("job->firstJob",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4d07,"void ZSTDMT_compressionJob(void *)");
    }
    if (0xffffffffffffff88 < sVar6) goto LAB_00171b5c;
LAB_001716fd:
    ppVar1 = *(pthread_mutex_t **)((long)jobDescription + 0x80);
    local_f8.pos = local_d8;
    local_f8.size = sStack_d0;
    src = *(BYTE **)((long)jobDescription + 0xa8);
    uVar10 = *(ulong *)((long)jobDescription + 0xb0);
    uVar14 = *(uint *)((long)jobDescription + 0xb8);
    local_f8.seq = prVar21;
    local_f8.capacity = uVar20;
    pthread_mutex_lock(ppVar1);
    uVar4 = *(uint *)((long)ppVar1 + 0x180);
    if (uVar4 < uVar14) {
      do {
        pthread_cond_wait((pthread_cond_t *)(ppVar1 + 1),ppVar1);
        uVar4 = *(uint *)((long)ppVar1 + 0x180);
      } while (uVar4 < uVar14);
    }
    if (uVar4 == uVar14) {
      if (*(int *)((long)ppVar1 + 0xb8) != 0) {
        if ((((prVar21 == (rawSeq *)0x0) || (local_f8.pos != 0)) || (local_f8.size != 0)) ||
           (uVar20 == 0)) {
          __assert_fail("seqStore.seq != NULL && seqStore.pos == 0 && seqStore.size == 0 && seqStore.capacity > 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4c90,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        if (*(ulong *)((long)ppVar1 + 0xa8) < uVar10) {
          __assert_fail("src.size <= serialState->params.jobSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4c91,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        ldmState = (ldmState_t *)((long)ppVar1 + 0xe8);
        if (uVar10 != 0) {
          lVar9 = ppVar1[6].__align;
          if (lVar9 == 0) {
            __assert_fail("window->base != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2226,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
          }
          if (*(long *)((long)ppVar1 + 0xf8) == 0) {
            __assert_fail("window->dictBase != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2227,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)");
          }
          pBVar11 = (ldmState->window).nextSrc;
          if (pBVar11 == src) {
            uVar8 = (ulong)*(uint *)((long)ppVar1 + 0x100);
            lVar9 = *(long *)((long)ppVar1 + 0xf8);
            uVar14 = *(uint *)((long)ppVar1 + 0x104);
          }
          else {
            uVar8 = (long)pBVar11 - lVar9;
            uVar14 = *(uint *)((long)ppVar1 + 0x100);
            *(uint *)((long)ppVar1 + 0x104) = uVar14;
            if (uVar8 >> 0x20 != 0) {
              __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x222e,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t)")
              ;
            }
            uVar4 = (uint)uVar8;
            *(uint *)((long)ppVar1 + 0x100) = uVar4;
            *(long *)((long)ppVar1 + 0xf8) = lVar9;
            ppVar1[6].__align = (long)src - uVar8;
            if (uVar4 - uVar14 < 8) {
              *(uint *)((long)ppVar1 + 0x104) = uVar4;
              uVar14 = uVar4;
            }
          }
          pBVar11 = src + uVar10;
          (ldmState->window).nextSrc = pBVar11;
          if (((BYTE *)((ulong)uVar14 + lVar9) < pBVar11) &&
             (src < (BYTE *)(lVar9 + (uVar8 & 0xffffffff)))) {
            uVar2 = (undefined4)((long)pBVar11 - lVar9);
            if ((long)(uVar8 & 0xffffffff) < (long)pBVar11 - lVar9) {
              uVar2 = (undefined4)uVar8;
            }
            *(undefined4 *)((long)ppVar1 + 0x104) = uVar2;
          }
        }
        sVar6 = ZSTD_ldm_generateSequences
                          (ldmState,&local_f8,(ldmParams_t *)((long)ppVar1 + 0xb8),src,uVar10);
        if (0xffffffffffffff88 < sVar6) {
          __assert_fail("!ZSTD_isError(error)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4c97,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        pthread_mutex_lock((pthread_mutex_t *)((long)ppVar1 + 0x188));
        ppVar1[0xc].__align = (long)(ldmState->window).nextSrc;
        *(long *)((long)ppVar1 + 0x1e8) = ppVar1[6].__align;
        *(undefined8 *)((long)ppVar1 + 0x1f0) = *(undefined8 *)((long)ppVar1 + 0xf8);
        *(undefined8 *)((long)ppVar1 + 0x1f8) = *(undefined8 *)((long)ppVar1 + 0x100);
        pthread_cond_signal((pthread_cond_t *)((long)ppVar1 + 0x1b0));
        pthread_mutex_unlock((pthread_mutex_t *)((long)ppVar1 + 0x188));
      }
      if (uVar10 != 0 && *(int *)((long)ppVar1 + 0x7c) != 0) {
        ZSTD_XXH64_update((XXH64_state_t *)((long)ppVar1 + 0x128),src,uVar10);
      }
    }
    *(int *)((long)ppVar1 + 0x180) = *(int *)((long)ppVar1 + 0x180) + 1;
    pthread_cond_broadcast((pthread_cond_t *)(ppVar1 + 1));
    pthread_mutex_unlock(ppVar1);
    if (local_f8.size != 0) {
      if ((cctx->stage != ZSTDcs_init) || ((cctx->appliedParams).ldmParams.enableLdm != 0)) {
        if (*(int *)((long)ppVar1 + 0xb8) != 0) {
          __assert_fail("!ZSTD_isError(err)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4cac,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
LAB_00171c4a:
        __assert_fail("serialState->params.ldmParams.enableLdm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4cab,
                      "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                     );
      }
      (cctx->externSeqStore).seq = local_f8.seq;
      (cctx->externSeqStore).size = local_f8.size;
      (cctx->externSeqStore).capacity = local_f8.size;
      (cctx->externSeqStore).pos = 0;
      if (*(int *)((long)ppVar1 + 0xb8) == 0) goto LAB_00171c4a;
    }
    if (*(int *)((long)jobDescription + 0xbc) == 0) {
      sVar6 = ZSTD_compressContinue_internal
                        (cctx,dst,dstCapacity,*(void **)((long)jobDescription + 0xa8),0,1,0);
      if (0xffffffffffffff88 < sVar6) goto LAB_00171b5c;
      ZSTD_invalidateRepCodes(cctx);
    }
    if (0x7ffffffe < *(ulong *)((long)jobDescription + 0xb0) >> 0x13) {
      __assert_fail("job->src.size < ((size_t)INT_MAX) * chunkSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4d28,"void ZSTDMT_compressionJob(void *)");
    }
    if (*(long *)((long)jobDescription + 8) != 0) {
      __assert_fail("job->cSize == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4d2a,"void ZSTDMT_compressionJob(void *)");
    }
    uVar10 = *(ulong *)((long)jobDescription + 0xb0) + 0x7ffff >> 0x13;
    pvVar13 = (void *)(dstCapacity + (long)dst);
    local_138 = *(void **)((long)jobDescription + 0xa8);
    iVar3 = (int)uVar10;
    if (1 < iVar3) {
      lVar15 = uVar10 - 1;
      lVar9 = 0x80000;
      pvVar19 = pvVar13;
      do {
        lVar16 = lVar9;
        local_140 = (pthread_mutex_t *)((long)jobDescription + 0x10);
        pvVar13 = pvVar19;
        uVar10 = ZSTD_compressContinue_internal
                           (cctx,dst,(long)pvVar19 - (long)dst,
                            (void *)((long)local_138 + lVar16 + -0x80000),0x80000,1,0);
        if (0xffffffffffffff88 < uVar10) {
          pthread_mutex_lock(local_140);
          goto LAB_00171bbb;
        }
        dst = (void *)((long)dst + uVar10);
        if (pvVar19 <= dst) {
          __assert_fail("op < oend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4d2f,"void ZSTDMT_compressionJob(void *)");
        }
        pthread_mutex_lock(local_140);
        *(long *)((long)jobDescription + 8) = *(long *)((long)jobDescription + 8) + uVar10;
        *(long *)jobDescription = lVar16;
        pthread_cond_signal((pthread_cond_t *)((long)jobDescription + 0x38));
        pthread_mutex_unlock(local_140);
        lVar15 = lVar15 + -1;
        lVar9 = lVar16 + 0x80000;
        pvVar19 = pvVar13;
      } while (lVar15 != 0);
      local_138 = (void *)((long)local_138 + lVar16);
    }
    if (0 < iVar3 || *(int *)((long)jobDescription + 0xc0) != 0) {
      uVar10 = *(ulong *)((long)jobDescription + 0xb0);
      uVar12 = (ulong)((uint)uVar10 & 0x7ffff);
      uVar8 = uVar12;
      if ((uVar10 & 0x7ffff) == 0) {
        uVar8 = 0x80000;
      }
      if (uVar10 < 0x80000) {
        uVar8 = uVar12;
      }
      if (*(int *)((long)jobDescription + 0xc0) == 0) {
        uVar10 = ZSTD_compressContinue_internal
                           (cctx,dst,(long)pvVar13 - (long)dst,local_138,uVar8,1,0);
      }
      else {
        uVar10 = ZSTD_compressEnd(cctx,dst,(long)pvVar13 - (long)dst,local_138,uVar8);
      }
      if (uVar10 < 0xffffffffffffff89) goto LAB_001714fc;
      pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
LAB_00171bbb:
      *(ulong *)((long)jobDescription + 8) = uVar10;
      goto LAB_001714f1;
    }
  }
  uVar10 = 0;
LAB_001714fc:
  uVar8 = *(ulong *)((long)jobDescription + 8);
  ppVar1 = *(pthread_mutex_t **)((long)jobDescription + 0x80);
  uVar14 = *(uint *)((long)jobDescription + 0xb8);
  pthread_mutex_lock(ppVar1);
  if (*(uint *)((long)ppVar1 + 0x180) <= uVar14) {
    if (uVar8 < 0xffffffffffffff89) {
      __assert_fail("ZSTD_isError(cSize)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4cb6,
                    "void ZSTDMT_serialState_ensureFinished(serialState_t *, unsigned int, size_t)")
      ;
    }
    *(uint *)((long)ppVar1 + 0x180) = uVar14 + 1;
    pthread_cond_broadcast((pthread_cond_t *)(ppVar1 + 1));
    pthread_mutex_lock((pthread_mutex_t *)((long)ppVar1 + 0x188));
    iVar3 = ppVar1[0xc].__data.__lock - *(int *)((long)ppVar1 + 0x1e8);
    *(int *)((long)ppVar1 + 0x1fc) = iVar3;
    *(int *)((long)ppVar1 + 0x1f8) = iVar3;
    pthread_cond_signal((pthread_cond_t *)((long)ppVar1 + 0x1b0));
    pthread_mutex_unlock((pthread_mutex_t *)((long)ppVar1 + 0x188));
  }
  pthread_mutex_unlock(ppVar1);
  buf.capacity = uVar20 * 0xc;
  buf.start = prVar21;
  ZSTDMT_releaseBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78),buf);
  if (cctx != (ZSTD_CCtx *)0x0) {
    ppVar1 = *(pthread_mutex_t **)((long)jobDescription + 0x68);
    pthread_mutex_lock(ppVar1);
    iVar3 = *(int *)((long)ppVar1 + 0x2c);
    if (iVar3 < ppVar1[1].__data.__lock) {
      *(int *)((long)ppVar1 + 0x2c) = iVar3 + 1;
      *(ZSTD_CCtx **)((long)ppVar1 + (long)iVar3 * 8 + 0x48) = cctx;
    }
    else {
      ZSTD_freeCCtx(cctx);
    }
    pthread_mutex_unlock(ppVar1);
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
  if (uVar10 != 0 && 0xffffffffffffff88 < *(ulong *)((long)jobDescription + 8)) {
    __assert_fail("lastCBlockSize == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4d50,"void ZSTDMT_compressionJob(void *)");
  }
  *(ulong *)((long)jobDescription + 8) = *(ulong *)((long)jobDescription + 8) + uVar10;
  *(undefined8 *)jobDescription = *(undefined8 *)((long)jobDescription + 0xb0);
  pthread_cond_signal((pthread_cond_t *)((long)jobDescription + 0x38));
  pthread_mutex_unlock((pthread_mutex_t *)((long)jobDescription + 0x10));
  return;
}

Assistant:

static void ZSTDMT_compressionJob(void* jobDescription)
{
    ZSTDMT_jobDescription* const job = (ZSTDMT_jobDescription*)jobDescription;
    ZSTD_CCtx_params jobParams = job->params;   /* do not modify job->params ! copy it, modify the copy */
    ZSTD_CCtx* const cctx = ZSTDMT_getCCtx(job->cctxPool);
    rawSeqStore_t rawSeqStore = ZSTDMT_getSeq(job->seqPool);
    buffer_t dstBuff = job->dstBuff;
    size_t lastCBlockSize = 0;

    /* resources */
    if (cctx==NULL) JOB_ERROR(ERROR(memory_allocation));
    if (dstBuff.start == NULL) {   /* streaming job : doesn't provide a dstBuffer */
        dstBuff = ZSTDMT_getBuffer(job->bufPool);
        if (dstBuff.start==NULL) JOB_ERROR(ERROR(memory_allocation));
        job->dstBuff = dstBuff;   /* this value can be read in ZSTDMT_flush, when it copies the whole job */
    }
    if (jobParams.ldmParams.enableLdm && rawSeqStore.seq == NULL)
        JOB_ERROR(ERROR(memory_allocation));

    /* Don't compute the checksum for chunks, since we compute it externally,
     * but write it in the header.
     */
    if (job->jobID != 0) jobParams.fParams.checksumFlag = 0;
    /* Don't run LDM for the chunks, since we handle it externally */
    jobParams.ldmParams.enableLdm = 0;


    /* init */
    if (job->cdict) {
        size_t const initError = ZSTD_compressBegin_advanced_internal(cctx, NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast, job->cdict, &jobParams, job->fullFrameSize);
        assert(job->firstJob);  /* only allowed for first job */
        if (ZSTD_isError(initError)) JOB_ERROR(initError);
    } else {  /* srcStart points at reloaded section */
        U64 const pledgedSrcSize = job->firstJob ? job->fullFrameSize : job->src.size;
        {   size_t const forceWindowError = ZSTD_CCtxParams_setParameter(&jobParams, ZSTD_c_forceMaxWindow, !job->firstJob);
            if (ZSTD_isError(forceWindowError)) JOB_ERROR(forceWindowError);
        }
        {   size_t const initError = ZSTD_compressBegin_advanced_internal(cctx,
                                        job->prefix.start, job->prefix.size, ZSTD_dct_rawContent, /* load dictionary in "content-only" mode (no header analysis) */
                                        ZSTD_dtlm_fast,
                                        NULL, /*cdict*/
                                        &jobParams, pledgedSrcSize);
            if (ZSTD_isError(initError)) JOB_ERROR(initError);
    }   }

    /* Perform serial step as early as possible, but after CCtx initialization */
    ZSTDMT_serialState_update(job->serial, cctx, rawSeqStore, job->src, job->jobID);

    if (!job->firstJob) {  /* flush and overwrite frame header when it's not first job */
        size_t const hSize = ZSTD_compressContinue(cctx, dstBuff.start, dstBuff.capacity, job->src.start, 0);
        if (ZSTD_isError(hSize)) JOB_ERROR(hSize);
        DEBUGLOG(5, "ZSTDMT_compressionJob: flush and overwrite %u bytes of frame header (not first job)", (U32)hSize);
        ZSTD_invalidateRepCodes(cctx);
    }

    /* compress */
    {   size_t const chunkSize = 4*ZSTD_BLOCKSIZE_MAX;
        int const nbChunks = (int)((job->src.size + (chunkSize-1)) / chunkSize);
        const BYTE* ip = (const BYTE*) job->src.start;
        BYTE* const ostart = (BYTE*)dstBuff.start;
        BYTE* op = ostart;
        BYTE* oend = op + dstBuff.capacity;
        int chunkNb;
        if (sizeof(size_t) > sizeof(int)) assert(job->src.size < ((size_t)INT_MAX) * chunkSize);   /* check overflow */
        DEBUGLOG(5, "ZSTDMT_compressionJob: compress %u bytes in %i blocks", (U32)job->src.size, nbChunks);
        assert(job->cSize == 0);
        for (chunkNb = 1; chunkNb < nbChunks; chunkNb++) {
            size_t const cSize = ZSTD_compressContinue(cctx, op, oend-op, ip, chunkSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            ip += chunkSize;
            op += cSize; assert(op < oend);
            /* stats */
            ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
            job->cSize += cSize;
            job->consumed = chunkSize * chunkNb;
            DEBUGLOG(5, "ZSTDMT_compressionJob: compress new block : cSize==%u bytes (total: %u)",
                        (U32)cSize, (U32)job->cSize);
            ZSTD_pthread_cond_signal(&job->job_cond);   /* warns some more data is ready to be flushed */
            ZSTD_pthread_mutex_unlock(&job->job_mutex);
        }
        /* last block */
        assert(chunkSize > 0);
        assert((chunkSize & (chunkSize - 1)) == 0);  /* chunkSize must be power of 2 for mask==(chunkSize-1) to work */
        if ((nbChunks > 0) | job->lastJob /*must output a "last block" flag*/ ) {
            size_t const lastBlockSize1 = job->src.size & (chunkSize-1);
            size_t const lastBlockSize = ((lastBlockSize1==0) & (job->src.size>=chunkSize)) ? chunkSize : lastBlockSize1;
            size_t const cSize = (job->lastJob) ?
                 ZSTD_compressEnd     (cctx, op, oend-op, ip, lastBlockSize) :
                 ZSTD_compressContinue(cctx, op, oend-op, ip, lastBlockSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            lastCBlockSize = cSize;
    }   }

_endJob:
    ZSTDMT_serialState_ensureFinished(job->serial, job->jobID, job->cSize);
    if (job->prefix.size > 0)
        DEBUGLOG(5, "Finished with prefix: %zx", (size_t)job->prefix.start);
    DEBUGLOG(5, "Finished with source: %zx", (size_t)job->src.start);
    /* release resources */
    ZSTDMT_releaseSeq(job->seqPool, rawSeqStore);
    ZSTDMT_releaseCCtx(job->cctxPool, cctx);
    /* report */
    ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
    if (ZSTD_isError(job->cSize)) assert(lastCBlockSize == 0);
    job->cSize += lastCBlockSize;
    job->consumed = job->src.size;  /* when job->consumed == job->src.size , compression job is presumed completed */
    ZSTD_pthread_cond_signal(&job->job_cond);
    ZSTD_pthread_mutex_unlock(&job->job_mutex);
}